

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

int restincurl::RequestBuilder::debug_callback
              (CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  ostream *poVar1;
  string msg;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  if (type < 8) {
    std::__cxx11::string::assign((char *)&local_38);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
            (data,data + size,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::clog);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

static int debug_callback(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp) {

            std::string msg;
            switch(type) {
            case CURLINFO_TEXT:
                msg = "==> Info: ";
                break;
            case CURLINFO_HEADER_OUT:
                msg =  "=> Send header: ";
                break;
            case CURLINFO_DATA_OUT:
                msg = "=> Send data: ";
                break;
            case CURLINFO_SSL_DATA_OUT:
                msg = "=> Send SSL data: ";
                break;
            case CURLINFO_HEADER_IN:
                msg = "<= Recv header: ";
                break;
            case CURLINFO_DATA_IN:
                msg = "<= Recv data: ";
                break;
            case CURLINFO_SSL_DATA_IN:
                msg = "<= Recv SSL data: ";
                break;
            case CURLINFO_END: // Don't seems to be used
                msg = "<= End: ";
                break;
            }

            std::copy(data, data + size, std::back_inserter(msg));
            RESTINCURL_LOG(handle << " " << msg);
            return 0;
        }